

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testmatmultc.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Boolean BVar9;
  void *__ptr;
  void *__ptr_00;
  double *__ptr_01;
  void *__ptr_02;
  double dVar10;
  double dVar11;
  int dims [2];
  int ndim;
  double *tmpc;
  double *tmpb;
  double *tmpa;
  char tb;
  char ta;
  char transb [5];
  char transa [5];
  int nums_k [2];
  int nums_n [2];
  int nums_m [2];
  int me;
  int ntimes;
  int itime;
  double avg_mf [4];
  double avg_t [4];
  double mf;
  double t1;
  double a;
  int g_a;
  int g_b;
  int g_c;
  double *h0;
  int ii;
  int i;
  int num_k;
  int num_n;
  int num_m;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  double *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  void *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  char in_stack_fffffffffffffef6;
  char in_stack_fffffffffffffef7;
  int in_stack_ffffffffffffff00;
  char cVar12;
  char cVar13;
  undefined4 uVar14;
  undefined1 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  int num_k_00;
  undefined8 uVar19;
  uint local_ac;
  double dStack_a8;
  int *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  double *in_stack_ffffffffffffff88;
  double *in_stack_ffffffffffffff90;
  int local_34;
  int local_30;
  undefined1 local_20 [8];
  undefined1 local_18 [4];
  undefined4 local_14;
  
  local_14 = 0;
  uVar19 = 0x40000000200;
  uVar18 = 0x200;
  num_k_00 = 0x400;
  iVar8 = 0x200;
  uVar17 = 0x400;
  uVar16 = 0x6e6e6e6e;
  uVar14 = 0x6e6e6e6e;
  uVar15 = 0;
  MPI_Init(local_18,local_20);
  BVar9 = MA_init((Integer)in_stack_fffffffffffffee8,(Integer)in_stack_fffffffffffffee0,
                  (Integer)in_stack_fffffffffffffed8);
  if (BVar9 == 0) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffecc);
  }
  GA_Initialize();
  iVar3 = GA_Nodeid();
  __ptr = malloc(0x800000);
  __ptr_00 = malloc(0x800000);
  __ptr_01 = (double *)malloc(0x800000);
  __ptr_02 = malloc(0x800000);
  local_34 = 0;
  for (local_30 = 0; local_30 < 0x100000; local_30 = local_30 + 1) {
    local_34 = local_34 + 1;
    if (0x400 < local_34) {
      local_34 = 0;
    }
    *(double *)((long)__ptr + (long)local_30 * 8) = (double)local_34;
  }
  for (local_34 = 0; local_34 < 2; local_34 = local_34 + 1) {
    iVar7 = *(int *)(&stack0xffffffffffffff44 + (long)local_34 * 4);
    iVar1 = *(int *)(&stack0xffffffffffffff3c + (long)local_34 * 4);
    iVar2 = *(int *)(&stack0xffffffffffffff34 + (long)local_34 * 4);
    if (((0x400 < iVar7) || (0x400 < iVar1)) || (0x400 < iVar2)) {
      GA_Error((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    }
    iVar4 = NGA_Create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                       (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (iVar4 == 0) {
      GA_Error((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    }
    iVar5 = NGA_Create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                       (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (iVar5 == 0) {
      GA_Error((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    }
    iVar5 = iVar2;
    iVar6 = NGA_Create(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                       (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (iVar6 == 0) {
      GA_Error((char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffecc);
    }
    if (iVar3 == 0) {
      load_ga((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
              in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
      load_ga((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8,
              in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
    }
    GA_Zero(in_stack_fffffffffffffed4);
    GA_Sync();
    iVar6 = GA_Nodeid();
    if (iVar6 == 0) {
      printf("\nMatrix Multiplication on C = A[%ld,%ld]xB[%ld,%ld]\n",(long)iVar7,(long)iVar2,
             (long)iVar2,(long)iVar1);
      fflush(_stdout);
    }
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      *(undefined8 *)(&stack0xffffffffffffff78 + (long)local_30 * 8) = 0;
      (&dStack_a8)[local_30] = 0.0;
    }
    for (local_ac = 0; (int)local_ac < 5; local_ac = local_ac + 1) {
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        GA_Sync();
        cVar13 = (&stack0xffffffffffffff2f)[local_30];
        cVar12 = (&stack0xffffffffffffff2a)[local_30];
        dVar10 = (double)MPI_Wtime();
        in_stack_fffffffffffffed0 = iVar4;
        GA_Dgemm(in_stack_fffffffffffffef7,in_stack_fffffffffffffef6,in_stack_fffffffffffffef0,
                 (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8,
                 (double)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 in_stack_ffffffffffffff00,(double)CONCAT44(in_stack_fffffffffffffed4,iVar4),iVar5);
        dVar11 = (double)MPI_Wtime();
        dVar11 = dVar11 - dVar10;
        if (iVar3 == 0) {
          iVar6 = GA_Nnodes();
          dVar10 = ((((double)iVar7 * 2.0 * (double)iVar1 * (double)iVar2) / dVar11) * 1e-06) /
                   (double)iVar6;
          *(double *)(&stack0xffffffffffffff78 + (long)local_30 * 8) =
               *(double *)(&stack0xffffffffffffff78 + (long)local_30 * 8) + dVar11;
          (&dStack_a8)[local_30] = (&dStack_a8)[local_30] + dVar10;
          printf("%15s%2d: %12.4f seconds %12.1f mflops/proc  %c %c\n",dVar11,dVar10,"Run#",
                 (ulong)local_ac,(ulong)(uint)(int)cVar13,(ulong)(uint)(int)cVar12);
          fflush(_stdout);
          if (local_ac == 0) {
            in_stack_fffffffffffffed0 = iVar4;
            in_stack_fffffffffffffed8 = __ptr_01;
            in_stack_fffffffffffffee0 = __ptr_00;
            in_stack_fffffffffffffee8 = __ptr_02;
            verify_ga_dgemm((char)((uint)iVar3 >> 0x18),(char)((uint)iVar3 >> 0x10),
                            (int)((ulong)uVar19 >> 0x20),(int)uVar19,num_k_00,
                            (double)CONCAT44(uVar18,uVar17),iVar8,in_stack_ffffffffffffff70,
                            (double)CONCAT17((char)uVar16,
                                             CONCAT16(uVar15,CONCAT42(uVar14,CONCAT11(cVar13,cVar12)
                                                                     ))),in_stack_ffffffffffffff78,
                            (double *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                            in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
          }
        }
      }
    }
    iVar7 = GA_Nodeid();
    if (iVar7 == 0) {
      printf("\n");
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        printf("%17s: %12.4f seconds %12.1f mflops/proc  %c %c\n",
               *(double *)(&stack0xffffffffffffff78 + (long)local_30 * 8) / 5.0,
               (&dStack_a8)[local_30] / 5.0,"Average",
               (ulong)(uint)(int)(char)(&stack0xffffffffffffff2f)[local_30],
               (ulong)(uint)(int)(char)(&stack0xffffffffffffff2a)[local_30]);
      }
      printf("All GA_Dgemms are verified...O.K.\n");
      fflush(_stdout);
    }
    GA_Destroy(in_stack_fffffffffffffed4);
    GA_Destroy(in_stack_fffffffffffffed4);
    GA_Destroy(in_stack_fffffffffffffed4);
  }
  iVar8 = GA_Nodeid();
  if (iVar8 == 0) {
    printf("All tests successful\n");
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  GA_Terminate();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    int num_m;
    int num_n;
    int num_k;
    int i;
    int ii;
    double *h0;
    int g_c;
    int g_b;
    int g_a;
    double a;
    double t1;
    double mf;
    double avg_t[ntrans];
    double avg_mf[ntrans];
    int itime;
    int ntimes;
    int me;
    int nums_m[/*howmany*/] = {512,1024};
    int nums_n[/*howmany*/] = {512,1024};
    int nums_k[/*howmany*/] = {512,1024};
    char transa[/*ntrans*/] = "nnnn";
    char transb[/*ntrans*/] = "nnnn";
    char ta;
    char tb;
    double *tmpa;
    double *tmpb;
    double *tmpc;
    int ndim;
    int dims[2];
#ifdef BLOCK_CYCLIC
    int block_size[2];
#endif

    MP_INIT(argc,argv);
    if (!MA_init(MT_DBL,1,20000000)) {
        GA_Error("failed: ma_init(MT_DBL,1,20000000)",10);
    }
    GA_INIT(argc,argv);
    me = GA_Nodeid();

    h0 = (double*)malloc(sizeof(double) * nummax*nummax);
    tmpa = (double*)malloc(sizeof(double) * nummax*nummax);
    tmpb = (double*)malloc(sizeof(double) * nummax*nummax);
    tmpc = (double*)malloc(sizeof(double) * nummax*nummax);

    ii = 0;
    for (i=0; i<nummax*nummax; i++) {
        ii = ii + 1;
        if (ii > nummax) {
            ii = 0;
        }
        h0[i] = ii;
    }

    /* Compute times assuming 500 mflops and 5 second target time */
    /* ntimes = max(3.0d0,5.0d0/(4.0d-9*num**3)); */
    ntimes = 5;

    for (ii=0; ii<howmany; ii++) {
        num_m = nums_m[ii];
        num_n = nums_n[ii];
        num_k = nums_k[ii];
        a = 0.5/(num_m*num_n);
        if (num_m > nummax || num_n > nummax || num_k > nummax) {
            GA_Error("Insufficient memory: check nummax", 1);
        }

#ifndef BLOCK_CYCLIC
        ndim = 2;

        dims[0] = num_m;
        dims[1] = num_n;
        if (!((g_c = NGA_Create(MT_DBL,ndim,dims,"g_c",NULL)))) {
            GA_Error("failed: create g_c",20);
        }

        dims[0] = num_k;
        dims[1] = num_n;
        if (!((g_b = NGA_Create(MT_DBL,ndim,dims,"g_b",NULL)))) {
            GA_Error("failed: create g_b",30);
        }

        dims[0] = num_m;
        dims[1] = num_k;
        if (!((g_a = NGA_Create(MT_DBL,ndim,dims,"g_a",NULL)))) {
            GA_Error("failed: create g_a",40);
        }
#else
        ndim = 2;
        block_size[0] = 128;
        block_size[1] = 128;

        dims[0] = num_m;
        dims[1] = num_n;
        g_c = GA_Create_handle();
        GA_Set_data(g_c,ndim,dims,MT_DBL);
        GA_Set_array_name(g_c,"g_c");
        GA_Set_block_cyclic(g_c,block_size);
        if (!GA_Allocate(g_c)) {
            GA_Error("failed: create g_c",40);
        }

        dims[0] = num_k;
        dims[1] = num_n;
        g_b = GA_Create_handle();
        GA_Set_data(g_b,ndim,dims,MT_DBL);
        GA_Set_array_name(g_b,"g_b");
        GA_Set_block_cyclic(g_b,block_size);
        if (!GA_Allocate(g_b)) {
            GA_Error("failed: create g_b",40);
        }

        dims[0] = num_m;
        dims[1] = num_k;
        g_a = GA_Create_handle();
        GA_Set_data(g_a,ndim,dims,MT_DBL);
        GA_Set_array_name(g_a,"g_a");
        GA_Set_block_cyclic(g_a,block_size);
        if (!GA_Allocate(g_a)) {
            GA_Error("failed: create g_a",40);
        }
#endif         

        /* Initialize matrices A and B */
        if (me == 0) { 
            load_ga(g_a, h0, num_m, num_k);
            load_ga(g_b, h0, num_k, num_n);
        }
        GA_Zero(g_c);
        GA_Sync();

        if (GA_Nodeid() == 0) {
            printf("\nMatrix Multiplication on C = A[%ld,%ld]xB[%ld,%ld]\n",
                    (long)num_m, (long)num_k, (long)num_k, (long)num_n);
            fflush(stdout);
        }

        for (i=0; i<ntrans; i++) {
            avg_t[i]  = 0.0;
            avg_mf[i] = 0.0;
        }

        for (itime=0; itime<ntimes; itime++) {
            for (i=0; i<ntrans; i++) {
                GA_Sync();
                ta = transa[i];
                tb = transb[i];
                t1 = MP_TIMER();
                GA_Dgemm(ta,tb,num_m,num_n,num_k,1.0, g_a, g_b, 0.0, g_c);
                t1 = MP_TIMER() - t1;
                if (me == 0) {
                    mf = 2e0*num_m*num_n*num_k/t1*1e-6/GA_Nnodes();
                    avg_t[i]  = avg_t[i]+t1;
                    avg_mf[i] = avg_mf[i] + mf;
                    printf("%15s%2d: %12.4f seconds %12.1f mflops/proc  %c %c\n",
                            "Run#", itime, t1, mf, ta, tb);
                    fflush(stdout);
                    if (dgemm_verify && itime == 0) {
                        /* recall the C API swaps the matrix order */
                        /* we swap it here for the Fortran-based verify */
                        verify_ga_dgemm(tb, ta, num_n, num_m, num_k, 1.0,
                                g_b, g_a, 0.0, g_c, tmpb, tmpa, tmpc);
                    }
                }
            }
        }

        if (GA_Nodeid() == 0) {
            printf("\n");
            for (i=0; i<ntrans; i++) {
                printf("%17s: %12.4f seconds %12.1f mflops/proc  %c %c\n",
                        "Average", avg_t[i]/ntimes, avg_mf[i]/ntimes,
                        transa[i], transb[i]);
            }
            if(dgemm_verify) {
                printf("All GA_Dgemms are verified...O.K.\n");
            }
            fflush(stdout);
        }

        /*
           GA_Print(g_a);
           GA_Print(g_b);
           GA_Print(g_c);
           */

        GA_Destroy(g_c);
        GA_Destroy(g_b);
        GA_Destroy(g_a);
    }

    /* ???
       format(a15, i2, ': ', e12.4, ' seconds ',f12.1, 
       .     ' mflops/proc ', 3a2)
       */
    if (GA_Nodeid() == 0) {
        printf("All tests successful\n");
    }

    free(h0);
    free(tmpa);
    free(tmpb);
    free(tmpc);

    GA_Terminate();
    MP_FINALIZE();
    return 0;
}